

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

int SHMLock(void)

{
  int iVar1;
  
  CCLock::Enter(&shm_critsec);
  Volatile<int>::operator++(&lock_count,0);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  Volatile<int>::Load(&lock_count);
  iVar1 = Volatile::operator_cast_to_int((Volatile *)&lock_count);
  return iVar1;
}

Assistant:

int SHMLock(void)
{
    shm_critsec.Enter();

    lock_count++;
    TRACE("SHM lock level is now %d\n", lock_count.Load());
    return lock_count;
}